

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Vec_Int_t * Abc_NtkWriteMiniMapping(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Str_t *p_01;
  char *pcVar4;
  long *plVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x33c,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
  }
  p = Abc_NtkDfs(pNtk,0);
  for (iVar13 = 0; iVar13 < pNtk->vCis->nSize; iVar13 = iVar13 + 1) {
    pAVar1 = Abc_NtkCi(pNtk,iVar13);
    (pAVar1->field_6).iTemp = iVar13;
  }
  iVar7 = 0;
  for (iVar11 = 0; iVar11 < p->nSize; iVar11 = iVar11 + 1) {
    pvVar2 = Vec_PtrEntry(p,iVar11);
    *(int *)((long)pvVar2 + 0x40) = iVar13 + iVar11;
    iVar7 = iVar7 + *(int *)((long)pvVar2 + 0x1c);
  }
  iVar13 = pNtk->vCos->nSize;
  iVar7 = iVar7 + pNtk->nObjCounts[7];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar13 + iVar7 + 0x2713U) {
    iVar11 = iVar13 + iVar7 + 0x2714;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar11;
  if (iVar11 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar11 << 2);
  }
  p_00->pArray = piVar3;
  Vec_IntPush(p_00,pNtk->vCis->nSize);
  Vec_IntPush(p_00,pNtk->vCos->nSize);
  Vec_IntPush(p_00,pNtk->nObjCounts[7]);
  Vec_IntPush(p_00,pNtk->nObjCounts[8]);
  p_01 = (Vec_Str_t *)malloc(0x10);
  p_01->nCap = 10000;
  p_01->nSize = 0;
  pcVar4 = (char *)malloc(10000);
  p_01->pArray = pcVar4;
  for (iVar13 = 0; iVar13 < p->nSize; iVar13 = iVar13 + 1) {
    plVar5 = (long *)Vec_PtrEntry(p,iVar13);
    Vec_IntPush(p_00,*(int *)((long)plVar5 + 0x1c));
    for (lVar9 = 0; lVar9 < *(int *)((long)plVar5 + 0x1c); lVar9 = lVar9 + 1) {
      Vec_IntPush(p_00,*(int *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                         (long)*(int *)(plVar5[4] + lVar9 * 4) * 8) + 0x40));
    }
    pcVar4 = Mio_GateReadName((Mio_Gate_t *)plVar5[7]);
    sVar6 = strlen(pcVar4);
    uVar10 = sVar6 & 0xffffffff;
    if ((int)sVar6 < 1) {
      uVar10 = 0;
    }
    for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      Vec_StrPush(p_01,pcVar4[uVar12]);
    }
    Vec_StrPush(p_01,'\0');
  }
  for (iVar13 = 0; iVar13 < pNtk->vCos->nSize; iVar13 = iVar13 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,iVar13);
    Vec_IntPush(p_00,*(int *)((long)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray] + 0x40));
  }
  for (iVar13 = p_01->nSize % 4 + -4; iVar13 != 0; iVar13 = iVar13 + 1) {
    Vec_StrPush(p_01,'\0');
  }
  if ((p_01->nSize & 3U) == 0) {
    uVar8 = p_01->nSize >> 2;
    pcVar4 = p_01->pArray;
    uVar12 = 0;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = uVar12;
    }
    for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      Vec_IntPush(p_00,*(int *)(pcVar4 + uVar12 * 4));
    }
    Vec_PtrFree(p);
    free(pcVar4);
    free(p_01);
    return p_00;
  }
  __assert_fail("Vec_StrSize(vGates) % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                ,0x35f,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
}

Assistant:

Vec_Int_t * Abc_NtkWriteMiniMapping( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vMapping;
    Vec_Str_t * vGates;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nNodes, nFanins, nExtra, * pArray;
    assert( Abc_NtkHasMapping(pNtk) );
    // collect nodes in the DFS order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // assign unique numbers
    nNodes = nFanins = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->iTemp = nNodes++, nFanins += Abc_ObjFaninNum(pObj);
    // allocate attay to store mapping (4 counters + fanins for each node + PO drivers + gate names)
    vMapping = Vec_IntAlloc( 4 + Abc_NtkNodeNum(pNtk) + nFanins + Abc_NtkCoNum(pNtk) + 10000 );
    // write the numbers of CI/CO/Node/FF
    Vec_IntPush( vMapping, Abc_NtkCiNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkCoNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkNodeNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkLatchNum(pNtk) );
    // write the nodes
    vGates = Vec_StrAlloc( 10000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntPush( vMapping, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vMapping, pFanin->iTemp );
        // remember this gate (to be added to the mapping later)
        Vec_StrPrintStr( vGates, Mio_GateReadName((Mio_Gate_t *)pObj->pData) );
        Vec_StrPush( vGates, '\0' );
    }
    // write the COs literals
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_IntPush( vMapping, Abc_ObjFanin0(pObj)->iTemp );
    // finish off the array
    nExtra = 4 - Vec_StrSize(vGates) % 4;
    for ( i = 0; i < nExtra; i++ )
        Vec_StrPush( vGates, '\0' );
    // add gates to the array
    assert( Vec_StrSize(vGates) % 4 == 0 );
    nExtra = Vec_StrSize(vGates) / 4;
    pArray = (int *)Vec_StrArray(vGates);
    for ( i = 0; i < nExtra; i++ )
        Vec_IntPush( vMapping, pArray[i] );
    // cleanup and return
    Vec_PtrFree( vNodes );
    Vec_StrFree( vGates );
    return vMapping;
}